

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O1

void __thiscall argsman_tests::util_GetBoolArg::test_method(util_GetBoolArg *this)

{
  byte bVar1;
  undefined8 uVar2;
  bool bVar3;
  readonly_property65 rVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long lVar7;
  long *plVar8;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  string error;
  char *argv_test [7];
  TestArgsManager testArgs;
  check_type cVar9;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  assertion_result local_460;
  char **local_448;
  assertion_result local_440;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  unique_lock<std::recursive_mutex> local_3d8;
  undefined1 local_3c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  uint local_3a8;
  string local_3a0 [32];
  undefined4 local_380;
  string local_378 [32];
  undefined4 local_358;
  string local_350 [32];
  undefined4 local_330;
  string local_328 [32];
  undefined4 local_308;
  string local_300 [16];
  long local_2f0 [2];
  undefined4 local_2e0;
  string local_2d8;
  char *local_2b8;
  char *pcStack_2b0;
  char *local_2a8;
  char *pcStack_2a0;
  char *local_298;
  char *pcStack_290;
  char *local_288;
  ArgsManager local_280;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_280);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_280.m_network_only_args._M_t);
  local_288 = "-f=true";
  local_298 = "-d=1";
  pcStack_290 = "-e=false";
  local_2a8 = "-nob";
  pcStack_2a0 = "-c=0";
  local_2b8 = "ignored";
  pcStack_2b0 = "-a";
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  local_3d8._M_owns = false;
  local_3d8._M_device = (mutex_type *)&local_280;
  std::unique_lock<std::recursive_mutex>::lock(&local_3d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3c8,"-a",(allocator<char> *)&local_440);
  local_3a8 = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"-b",(allocator<char> *)&local_440);
  local_380 = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_378,"-c",(allocator<char> *)&local_440);
  local_358 = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_350,"-d",(allocator<char> *)&local_440);
  local_330 = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_328,"-e",(allocator<char> *)&local_440);
  local_308 = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_300,"-f",(allocator<char> *)&local_440);
  local_2e0 = 1;
  __l._M_len = 6;
  __l._M_array = (iterator)local_3c8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&local_460,__l,(allocator_type *)&local_440);
  TestArgsManager::SetupArgs
            ((TestArgsManager *)&local_280,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)&local_460);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&local_460);
  lVar7 = -0xf0;
  plVar8 = local_2f0;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -5;
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0);
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x150;
  file.m_begin = (iterator)&local_3e8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3f8,msg);
  bVar3 = ArgsManager::ParseParameters(&local_280,7,&local_2b8,&local_2d8);
  local_460.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar3;
  local_460.m_message.px = (element_type *)0x0;
  local_460.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_440._0_8_ = "testArgs.ParseParameters(7, argv_test, error)";
  local_440.m_message.px = (element_type *)0xe56559;
  local_3c8._8_8_ = local_3c8._8_8_ & 0xffffffffffffff00;
  local_3c8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_3b8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_400 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_3b8._8_8_ = (allocator_type *)&local_440;
  boost::test_tools::tt_detail::report_assertion
            (&local_460,(lazy_ostream *)local_3c8,1,0,WARN,_cVar9,(size_t)&local_408,0x150);
  boost::detail::shared_count::~shared_count(&local_460.m_message.pn);
  lVar7 = 0;
  do {
    bVar1 = "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"[lVar7 + 0x3a];
    local_418 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_410 = "";
    local_428 = &boost::unit_test::basic_cstring<char_const>::null;
    local_420 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x154;
    file_00.m_begin = (iterator)&local_418;
    msg_00.m_end = pvVar6;
    msg_00.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_428,
               msg_00);
    uVar2 = local_3b8._M_allocated_capacity;
    local_3c8._0_8_ = &local_3b8;
    local_3b8._M_allocated_capacity._0_2_ = (ushort)bVar1 << 8 | 0x2d;
    local_3c8._8_8_ = 2;
    local_3b8._M_allocated_capacity._3_5_ = SUB85(uVar2,3);
    local_3b8._M_local_buf[2] = 0;
    bVar3 = ArgsManager::IsArgSet(&local_280,(string *)local_3c8);
    local_440.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(bVar3 || bVar1 == 0);
    local_440.m_message.px = (element_type *)0x0;
    local_440.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_470 = "testArgs.IsArgSet({\'-\', opt}) || !opt";
    local_468 = "";
    local_460.m_message.px = (element_type *)((ulong)local_460.m_message.px & 0xffffffffffffff00);
    local_460._0_8_ = &PTR__lazy_ostream_013abc70;
    local_460.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_448 = &local_470;
    local_480 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_478 = "";
    pvVar5 = (iterator)0x1;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_440,(lazy_ostream *)&local_460,1,0,WARN,_cVar9,(size_t)&local_480,0x154);
    boost::detail::shared_count::~shared_count(&local_440.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._0_8_ != &local_3b8) {
      operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._M_allocated_capacity + 1));
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 7);
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x158;
  file_01.m_begin = (iterator)&local_490;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4a0,
             msg_01);
  local_460.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (local_280.m_settings.command_line_options._M_t._M_impl.super__Rb_tree_header._M_node_count
        == 6 && local_280.m_settings.ro_config._M_t._M_impl.super__Rb_tree_header._M_node_count == 0
       );
  local_460.m_message.px = (element_type *)0x0;
  local_460.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_440._0_8_ =
       "testArgs.m_settings.command_line_options.size() == 6 && testArgs.m_settings.ro_config.empty()"
  ;
  local_440.m_message.px = (element_type *)0xe56a94;
  local_3c8._8_8_ = local_3c8._8_8_ & 0xffffffffffffff00;
  local_3c8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_3b8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3b8._8_8_ = &local_440;
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_4a8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_460,(lazy_ostream *)local_3c8,1,0,WARN,_cVar9,(size_t)&local_4b0,0x158);
  boost::detail::shared_count::~shared_count(&local_460.m_message.pn);
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x15b;
  file_02.m_begin = (iterator)&local_4c0;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4d0,
             msg_02);
  local_3c8._0_8_ = &local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"-nob","");
  bVar3 = ArgsManager::IsArgSet(&local_280,(string *)local_3c8);
  local_440.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_440.m_message.px = (element_type *)0x0;
  local_440.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_470 = "!testArgs.IsArgSet(\"-nob\")";
  local_468 = "";
  local_460.m_message.px = (element_type *)((ulong)local_460.m_message.px & 0xffffffffffffff00);
  local_460._0_8_ = &PTR__lazy_ostream_013abc70;
  local_460.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_448 = &local_470;
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_4d8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_440,(lazy_ostream *)&local_460,1,0,WARN,_cVar9,(size_t)&local_4e0,0x15b);
  boost::detail::shared_count::~shared_count(&local_440.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._0_8_ != &local_3b8) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._M_allocated_capacity + 1));
  }
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x15e;
  file_03.m_begin = (iterator)&local_4f0;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_500,
             msg_03);
  local_3c8._0_8_ = &local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"-b","");
  rVar4.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::IsArgNegated(&local_280,(string *)local_3c8);
  local_440.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar4.super_readonly_property<bool>.super_class_property<bool>.value;
  local_440.m_message.px = (element_type *)0x0;
  local_440.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_470 = "testArgs.IsArgNegated(\"-b\")";
  local_468 = "";
  local_460.m_message.px = (element_type *)((ulong)local_460.m_message.px & 0xffffffffffffff00);
  local_460._0_8_ = &PTR__lazy_ostream_013abc70;
  local_460.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_448 = &local_470;
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_508 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_440,(lazy_ostream *)&local_460,1,0,WARN,_cVar9,(size_t)&local_510,0x15e);
  boost::detail::shared_count::~shared_count(&local_440.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._0_8_ != &local_3b8) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._M_allocated_capacity + 1));
  }
  local_520 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x15f;
  file_04.m_begin = (iterator)&local_520;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_530,
             msg_04);
  local_3c8._0_8_ = &local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"-a","");
  bVar3 = ArgsManager::IsArgNegated(&local_280,(string *)local_3c8);
  local_440.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_440.m_message.px = (element_type *)0x0;
  local_440.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_470 = "!testArgs.IsArgNegated(\"-a\")";
  local_468 = "";
  local_460.m_message.px = (element_type *)((ulong)local_460.m_message.px & 0xffffffffffffff00);
  local_460._0_8_ = &PTR__lazy_ostream_013abc70;
  local_460.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_448 = &local_470;
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_538 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_440,(lazy_ostream *)&local_460,1,0,WARN,_cVar9,(size_t)&local_540,0x15f);
  boost::detail::shared_count::~shared_count(&local_440.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._0_8_ != &local_3b8) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._M_allocated_capacity + 1));
  }
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x162;
  file_05.m_begin = (iterator)&local_550;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_560,
             msg_05);
  local_3c8._0_8_ = &local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"-a","");
  rVar4.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,(string *)local_3c8,false);
  local_440.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar4.super_readonly_property<bool>.super_class_property<bool>.value;
  local_440.m_message.px = (element_type *)0x0;
  local_440.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_470 = "testArgs.GetBoolArg(\"-a\", false) == true";
  local_468 = "";
  local_460.m_message.px = (element_type *)((ulong)local_460.m_message.px & 0xffffffffffffff00);
  local_460._0_8_ = &PTR__lazy_ostream_013abc70;
  local_460.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_448 = &local_470;
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_568 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_440,(lazy_ostream *)&local_460,1,0,WARN,_cVar9,(size_t)&local_570,0x162);
  boost::detail::shared_count::~shared_count(&local_440.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._0_8_ != &local_3b8) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._M_allocated_capacity + 1));
  }
  local_580 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x163;
  file_06.m_begin = (iterator)&local_580;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_590,
             msg_06);
  local_3c8._0_8_ = &local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"-b","");
  bVar3 = ArgsManager::GetBoolArg(&local_280,(string *)local_3c8,true);
  local_440.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_440.m_message.px = (element_type *)0x0;
  local_440.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_470 = "testArgs.GetBoolArg(\"-b\", true) == false";
  local_468 = "";
  local_460.m_message.px = (element_type *)((ulong)local_460.m_message.px & 0xffffffffffffff00);
  local_460._0_8_ = &PTR__lazy_ostream_013abc70;
  local_460.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_448 = &local_470;
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_598 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_440,(lazy_ostream *)&local_460,1,0,WARN,_cVar9,(size_t)&local_5a0,0x163);
  boost::detail::shared_count::~shared_count(&local_440.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._0_8_ != &local_3b8) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._M_allocated_capacity + 1));
  }
  local_5b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x164;
  file_07.m_begin = (iterator)&local_5b0;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_5c0,
             msg_07);
  local_3c8._0_8_ = &local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"-c","");
  bVar3 = ArgsManager::GetBoolArg(&local_280,(string *)local_3c8,true);
  local_440.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_440.m_message.px = (element_type *)0x0;
  local_440.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_470 = "testArgs.GetBoolArg(\"-c\", true) == false";
  local_468 = "";
  local_460.m_message.px = (element_type *)((ulong)local_460.m_message.px & 0xffffffffffffff00);
  local_460._0_8_ = &PTR__lazy_ostream_013abc70;
  local_460.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_448 = &local_470;
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5c8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_440,(lazy_ostream *)&local_460,1,0,WARN,_cVar9,(size_t)&local_5d0,0x164);
  boost::detail::shared_count::~shared_count(&local_440.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._0_8_ != &local_3b8) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._M_allocated_capacity + 1));
  }
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5d8 = "";
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x165;
  file_08.m_begin = (iterator)&local_5e0;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_5f0,
             msg_08);
  local_3c8._0_8_ = &local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"-d","");
  rVar4.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,(string *)local_3c8,false);
  local_440.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar4.super_readonly_property<bool>.super_class_property<bool>.value;
  local_440.m_message.px = (element_type *)0x0;
  local_440.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_470 = "testArgs.GetBoolArg(\"-d\", false) == true";
  local_468 = "";
  local_460.m_message.px = (element_type *)((ulong)local_460.m_message.px & 0xffffffffffffff00);
  local_460._0_8_ = &PTR__lazy_ostream_013abc70;
  local_460.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_448 = &local_470;
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5f8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_440,(lazy_ostream *)&local_460,1,0,WARN,_cVar9,(size_t)&local_600,0x165);
  boost::detail::shared_count::~shared_count(&local_440.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._0_8_ != &local_3b8) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._M_allocated_capacity + 1));
  }
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x166;
  file_09.m_begin = (iterator)&local_610;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_620,
             msg_09);
  local_3c8._0_8_ = &local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"-e","");
  bVar3 = ArgsManager::GetBoolArg(&local_280,(string *)local_3c8,true);
  local_440.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_440.m_message.px = (element_type *)0x0;
  local_440.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_470 = "testArgs.GetBoolArg(\"-e\", true) == false";
  local_468 = "";
  local_460.m_message.px = (element_type *)((ulong)local_460.m_message.px & 0xffffffffffffff00);
  local_460._0_8_ = &PTR__lazy_ostream_013abc70;
  local_460.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_448 = &local_470;
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_628 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_440,(lazy_ostream *)&local_460,1,0,WARN,_cVar9,(size_t)&local_630,0x166);
  boost::detail::shared_count::~shared_count(&local_440.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._0_8_ != &local_3b8) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._M_allocated_capacity + 1));
  }
  local_640 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x167;
  file_10.m_begin = (iterator)&local_640;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_650,
             msg_10);
  local_3c8._0_8_ = &local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"-f","");
  bVar3 = ArgsManager::GetBoolArg(&local_280,(string *)local_3c8,true);
  local_440.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_440.m_message.px = (element_type *)0x0;
  local_440.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_470 = "testArgs.GetBoolArg(\"-f\", true) == false";
  local_468 = "";
  local_460.m_message.px = (element_type *)((ulong)local_460.m_message.px & 0xffffffffffffff00);
  local_460._0_8_ = &PTR__lazy_ostream_013abc70;
  local_460.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_448 = &local_470;
  boost::test_tools::tt_detail::report_assertion
            (&local_440,(lazy_ostream *)&local_460,1,0,WARN,0xe56179,
             (size_t)&stack0xfffffffffffff9a0,0x167);
  boost::detail::shared_count::~shared_count(&local_440.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._0_8_ != &local_3b8) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._M_allocated_capacity + 1));
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_3d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,
                    CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                             local_2d8.field_2._M_local_buf[0]) + 1);
  }
  ArgsManager::~ArgsManager(&local_280);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_GetBoolArg)
{
    TestArgsManager testArgs;
    const auto a = std::make_pair("-a", ArgsManager::ALLOW_ANY);
    const auto b = std::make_pair("-b", ArgsManager::ALLOW_ANY);
    const auto c = std::make_pair("-c", ArgsManager::ALLOW_ANY);
    const auto d = std::make_pair("-d", ArgsManager::ALLOW_ANY);
    const auto e = std::make_pair("-e", ArgsManager::ALLOW_ANY);
    const auto f = std::make_pair("-f", ArgsManager::ALLOW_ANY);

    const char *argv_test[] = {
        "ignored", "-a", "-nob", "-c=0", "-d=1", "-e=false", "-f=true"};
    std::string error;
    LOCK(testArgs.cs_args);
    testArgs.SetupArgs({a, b, c, d, e, f});
    BOOST_CHECK(testArgs.ParseParameters(7, argv_test, error));

    // Each letter should be set.
    for (const char opt : "abcdef")
        BOOST_CHECK(testArgs.IsArgSet({'-', opt}) || !opt);

    // Nothing else should be in the map
    BOOST_CHECK(testArgs.m_settings.command_line_options.size() == 6 &&
                testArgs.m_settings.ro_config.empty());

    // The -no prefix should get stripped on the way in.
    BOOST_CHECK(!testArgs.IsArgSet("-nob"));

    // The -b option is flagged as negated, and nothing else is
    BOOST_CHECK(testArgs.IsArgNegated("-b"));
    BOOST_CHECK(!testArgs.IsArgNegated("-a"));

    // Check expected values.
    BOOST_CHECK(testArgs.GetBoolArg("-a", false) == true);
    BOOST_CHECK(testArgs.GetBoolArg("-b", true) == false);
    BOOST_CHECK(testArgs.GetBoolArg("-c", true) == false);
    BOOST_CHECK(testArgs.GetBoolArg("-d", false) == true);
    BOOST_CHECK(testArgs.GetBoolArg("-e", true) == false);
    BOOST_CHECK(testArgs.GetBoolArg("-f", true) == false);
}